

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_ManUtilSkipSpaces(Prs_Man_t *p)

{
  int iVar1;
  byte *pbVar2;
  ulong uVar3;
  int in_EDX;
  int extraout_EDX;
  
  do {
    pbVar2 = (byte *)p->pCur;
    if (p->pLimit <= p->pCur) {
LAB_0033a14e:
      Prs_ManErrorSet(p,"Unexpectedly reached end-of-file.",in_EDX);
      return 1;
    }
    while( true ) {
      uVar3 = (ulong)*pbVar2;
      if (0x20 < uVar3) break;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) goto LAB_0033a14e;
        break;
      }
      p->pCur = (char *)(pbVar2 + 1);
      pbVar2 = pbVar2 + 1;
    }
    iVar1 = Prs_ManUtilSkipComments(p);
    in_EDX = extraout_EDX;
    if (iVar1 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static inline int Prs_ManUtilSkipSpaces( Prs_Man_t * p )
{
    while ( p->pCur < p->pLimit )
    {
        while ( Prs_CharIsSpace(*p->pCur) ) 
            p->pCur++;
        if ( !*p->pCur )
            return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
        if ( !Prs_ManUtilSkipComments(p) )
            return 0;
    }
    return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
}